

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_any_construct_const.cpp
# Opt level: O3

int main(void)

{
  double dVar1;
  double *pdVar2;
  any a;
  any local_10;
  
  local_10._value = (erasure *)operator_new(0x10);
  (local_10._value)->_vptr_erasure = (_func_int **)&PTR__erasure_00103d70;
  local_10._value[1]._vptr_erasure = (_func_int **)0x400921f9f01b866e;
  pdVar2 = type::any::as<double>(&local_10);
  dVar1 = *pdVar2;
  if (local_10._value != (erasure *)0x0) {
    (*(local_10._value)->_vptr_erasure[1])();
  }
  return -(uint)(dVar1 != 3.14159);
}

Assistant:

int main() {
  try {
    type::any a(3.14159);
    if(a.as<double>() == 3.14159) {
      return 0;
    }
    return -1;
  }
  catch(...) {
    return -1;
  }
}